

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hpp
# Opt level: O2

void __thiscall duckdb::Iterator::Iterator(Iterator *this,ART *art)

{
  (this->current_key).key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->current_key).key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->current_key).key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->art = art;
  ::std::
  stack<duckdb::IteratorEntry,std::deque<duckdb::IteratorEntry,std::allocator<duckdb::IteratorEntry>>>
  ::stack<std::deque<duckdb::IteratorEntry,std::allocator<duckdb::IteratorEntry>>,void>
            (&this->nodes);
  (this->last_leaf).super_IndexPointer.data = 0;
  this->status = GATE_NOT_SET;
  this->nested_depth = '\0';
  this->entered_nested_leaf = false;
  return;
}

Assistant:

explicit Iterator(ART &art) : art(art), status(GateStatus::GATE_NOT_SET) {}